

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhFindSlavePage(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft,lhpage **ppSlave)

{
  sxu64 n64;
  int iVar1;
  sxu16 local_66;
  int local_64;
  int iStack_60;
  sxu16 size;
  int rc;
  sxi32 i;
  sxu16 iOfft;
  lhpage *pNew;
  unqlite_page *pRaw;
  lhpage *pSlave;
  lhpage *pMaster;
  lhash_kv_engine *pEngine;
  lhpage **ppSlave_local;
  sxu16 *pOfft_local;
  sxu64 nAmount_local;
  lhpage *pPage_local;
  
  pMaster = (lhpage *)pPage->pHash;
  pSlave = pPage->pMaster;
  pRaw = (unqlite_page *)pSlave->pSlave;
  pEngine = (lhash_kv_engine *)ppSlave;
  ppSlave_local = (lhpage **)pOfft;
  pOfft_local = (sxu16 *)nAmount;
  nAmount_local = (sxu64)pPage;
  for (iStack_60 = 0; iStack_60 < pSlave->iSlave; iStack_60 = iStack_60 + 1) {
    local_66 = (short)pOfft_local + 0x1a;
    local_64 = lhAllocateSpace((lhpage *)pRaw,(ulong)local_66,(sxu16 *)((long)&rc + 2));
    if (local_64 != 0) {
      local_66 = 0x1a;
      local_64 = lhAllocateSpace((lhpage *)pRaw,0x1a,(sxu16 *)((long)&rc + 2));
    }
    if (local_64 == 0) {
      if (ppSlave_local == (lhpage **)0x0) {
        local_64 = lhRestoreSpace((lhpage *)pRaw,rc._2_2_,local_66);
      }
      else {
        *(sxu16 *)ppSlave_local = rc._2_2_;
      }
      pEngine->pIo = (unqlite_kv_io *)pRaw;
      return local_64;
    }
    pRaw = (unqlite_page *)pRaw[3].pUserData;
  }
  pPage_local._4_4_ = lhAcquirePage((lhash_kv_engine *)pMaster,(unqlite_page **)&pNew);
  if (pPage_local._4_4_ == 0) {
    pRaw = (unqlite_page *)pSlave->pSlave;
    if ((lhpage *)pRaw == (lhpage *)0x0) {
      pRaw = (unqlite_page *)pSlave;
    }
    _i = (unqlite_kv_io *)lhNewPage((lhash_kv_engine *)pMaster,(unqlite_page *)pNew,pSlave);
    if (_i == (unqlite_kv_io *)0x0) {
      pPage_local._4_4_ = -1;
    }
    else {
      local_64 = lhSetEmptyPage((lhpage *)_i);
      if (local_64 == 0) {
        if (ppSlave_local != (lhpage **)0x0) {
          iVar1 = lhAllocateSpace((lhpage *)_i,(sxu64)(pOfft_local + 0xd),(sxu16 *)((long)&rc + 2));
          if (iVar1 != 0) {
            lhAllocateSpace((lhpage *)_i,0x1a,(sxu16 *)((long)&rc + 2));
          }
          *(sxu16 *)ppSlave_local = rc._2_2_;
        }
        local_64 = (*(pMaster->pHash->sAllocator).xMemError)(pRaw->pUserData);
        if (local_64 == 0) {
          n64._0_2_ = (pNew->sHdr).iOfft;
          n64._2_2_ = (pNew->sHdr).iFree;
          n64._4_4_ = *(undefined4 *)&(pNew->sHdr).field_0x4;
          SyBigEndianPack64((uchar *)(*pRaw->pUserData + 4),n64);
          pRaw[1].zData = *(uchar **)&pNew->sHdr;
          pEngine->pIo = _i;
          return 0;
        }
      }
      (*(code *)(pMaster->pHash->sAllocator).apPool[1])(_i->pMethods);
      pPage_local._4_4_ = local_64;
    }
  }
  return pPage_local._4_4_;
}

Assistant:

static int lhFindSlavePage(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft,lhpage **ppSlave)
{
	lhash_kv_engine *pEngine = pPage->pHash;
	lhpage *pMaster = pPage->pMaster;
	lhpage *pSlave = pMaster->pSlave;
	unqlite_page *pRaw;
	lhpage *pNew;
	sxu16 iOfft;
	sxi32 i;
	int rc;
	/* Look for an already attached slave page */
	for( i = 0 ; i < pMaster->iSlave ; ++i ){
		/* Find a free chunk big enough */
		sxu16 size = (sxu16)(L_HASH_CELL_SZ + nAmount);
		rc = lhAllocateSpace(pSlave,size,&iOfft);
		if( rc != UNQLITE_OK ){
			/* A space for cell header only */
			size = L_HASH_CELL_SZ;
			rc = lhAllocateSpace(pSlave,size,&iOfft);
		}
		if( rc == UNQLITE_OK ){
			/* All done */
			if( pOfft ){
				*pOfft = iOfft;
			}else{
				rc = lhRestoreSpace(pSlave, iOfft, size);
			}
			*ppSlave = pSlave;
			return rc;
		}
		/* Point to the next slave page */
		pSlave = pSlave->pNextSlave;
	}
	/* Acquire a new slave page */
	rc = lhAcquirePage(pEngine,&pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Last slave page */
	pSlave = pMaster->pSlave;
	if( pSlave == 0 ){
		/* First slave page */
		pSlave = pMaster;
	}
	/* Initialize the page */
	pNew = lhNewPage(pEngine,pRaw,pMaster);
	if( pNew == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Mark as an empty page */
	rc = lhSetEmptyPage(pNew);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	if( pOfft ){
		/* Look for a free block */
		if( UNQLITE_OK != lhAllocateSpace(pNew,L_HASH_CELL_SZ+nAmount,&iOfft) ){
			/* Cell header only */
			lhAllocateSpace(pNew,L_HASH_CELL_SZ,&iOfft); /* Never fail */
		}	
		*pOfft = iOfft;
	}
	/* Link this page to the previous slave page */
	rc = pEngine->pIo->xWrite(pSlave->pRaw);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Reflect in the page header */
	SyBigEndianPack64(&pSlave->pRaw->zData[2/*Cell offset*/+2/*Free block offset*/],pRaw->iPage);
	pSlave->sHdr.iSlave = pRaw->iPage;
	/* All done */
	*ppSlave = pNew;
	return UNQLITE_OK;
fail:
	pEngine->pIo->xPageUnref(pNew->pRaw); /* pNew will be released in this call */
	return rc;

}